

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void checkOptions(void)

{
  if (*booleanOptions == 0) {
LAB_00101cde:
    if (booleanOptions[1] != 0) goto LAB_00101ce4;
LAB_00101d0b:
    checkOptions_cold_3();
  }
  else {
    if (booleanOptions[1] != 0) goto LAB_00101d0b;
    if (*booleanOptions == 0) goto LAB_00101cde;
LAB_00101ce4:
    if (0 < *intOptions) {
      if ((booleanOptions[1] == 0) || (*stringOptions == (char *)0x0)) {
        return;
      }
      goto LAB_00101d15;
    }
  }
  checkOptions_cold_2();
LAB_00101d15:
  checkOptions_cold_1();
  next = next * 0x41c64e6d + 0x3039;
  return;
}

Assistant:

void checkOptions()
{
    if ( (booleanOptions[SAT] && booleanOptions[UNSAT])
        || (!booleanOptions[SAT] && !booleanOptions[UNSAT])
    )
    {
        fprintf (stderr, "You must specify either -sat or -unsat\n");
        printUsage();
    }

    if (intOptions[NUM_VARIABLES] <= 0)
    {
        fprintf (stderr, "You must specify num-of-variables to be at least 1\n");
        printUsage();
    }

    if (booleanOptions[UNSAT] && stringOptions[MODEL] != NULL)
    {
        fprintf (stderr, "You have specified -unsat and -m, but no model can be created for an unsatisfiable instance\n");
        printUsage();
    }
}